

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4495f9::ECTest_ZeroPadding_Test::TestBody(ECTest_ZeroPadding_Test *this)

{
  AssertionResult *pAVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  pointer peVar5;
  long *plVar6;
  char *pcVar7;
  char *in_R9;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  AssertHelper local_120;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__2;
  UniquePtr<EC_KEY> key;
  uint8_t large_buf [33];
  uint8_t buf [32];
  AssertHelper local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  UniquePtr<uint8_t> free_buf_alloc;
  size_t len;
  uint8_t *buf_alloc;
  
  DecodeECPrivateKey((anon_unknown_dwarf_4495f9 *)&key,"0w\x02\x01\x01\x04 ",0x79);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._1_7_ = 0;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>)
       key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>)
      key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)buf);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)large_buf,(internal *)&gtest_ar_,(AssertionResult *)0x55f7b2,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0xd0,(char *)CONCAT71(large_buf._1_7_,large_buf[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)buf);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    std::__cxx11::string::~string((string *)large_buf);
    if (buf._0_8_ != 0) {
      (**(code **)(*(long *)buf._0_8_ + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_00295b19;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gtest_ar_.success_ =
       EncodeECPrivateKey(&out,(EC_KEY *)
                               key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._1_7_ = 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)buf);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)large_buf,(internal *)&gtest_ar_,
               (AssertionResult *)"EncodeECPrivateKey(&out, key.get())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0xd2,(char *)CONCAT71(large_buf._1_7_,large_buf[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)buf);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    std::__cxx11::string::~string((string *)large_buf);
    if (buf._0_8_ != 0) {
      (**(code **)(*(long *)buf._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  gtest_ar_._1_7_ = 0x4c3b;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = 0x79;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._1_7_ = 0;
  buf._8_8_ = (long)out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
  buf._0_8_ = out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  testing::internal::CmpHelperEQ<Bytes,Bytes>
            ((internal *)large_buf,"Bytes(kECKeyWithZeros)","Bytes(out.data(), out.size())",
             (Bytes *)&gtest_ar_,(Bytes *)buf);
  if (large_buf[0] == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (large_buf._8_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)large_buf._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)buf,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0xd3,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)buf,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)buf);
    if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(large_buf + 8));
  buf[0] = ' ';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  sVar4 = EC_KEY_priv2oct((EC_KEY *)
                          key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl,(uint8_t *)0x0,0);
  gtest_ar_.success_ = SUB81(sVar4,0);
  gtest_ar_._1_7_ = SUB87(sVar4 >> 8,0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)large_buf,"32u","EC_KEY_priv2oct(key.get(), nullptr, 0)",(uint *)buf,
             (unsigned_long *)&gtest_ar_);
  if (large_buf[0] == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (large_buf._8_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)large_buf._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)buf,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0xd6,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)buf,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)buf);
    if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(large_buf + 8));
  gtest_ar__2._0_4_ = 0x20;
  sVar4 = EC_KEY_priv2oct((EC_KEY *)
                          key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl,buf,0x20);
  gtest_ar_.success_ = SUB81(sVar4,0);
  gtest_ar_._1_7_ = SUB87(sVar4 >> 8,0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)large_buf,"32u","EC_KEY_priv2oct(key.get(), buf, sizeof(buf))",
             (uint *)&gtest_ar__2,(unsigned_long *)&gtest_ar_);
  if (large_buf[0] == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (large_buf._8_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)large_buf._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0xd8,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_);
    pAVar1 = (AssertionResult *)large_buf;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    plVar6 = (long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_);
LAB_00295af9:
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&pAVar1->message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(large_buf + 8));
    gtest_ar_.success_ = SUB81(buf,0);
    gtest_ar_._1_7_ = SUB87((ulong)buf >> 8,0);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = 0x20;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._1_7_ = 0;
    gtest_ar__2._0_8_ = &(anonymous_namespace)::kECKeyWithZerosRawPrivate;
    gtest_ar__2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x20;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)large_buf,"Bytes(buf)","Bytes(kECKeyWithZerosRawPrivate)",
               (Bytes *)&gtest_ar_,(Bytes *)&gtest_ar__2);
    if (large_buf[0] == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      if (large_buf._8_8_ == 0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)large_buf._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0xd9,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
      if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(large_buf + 8));
    gtest_ar__2._0_8_ = gtest_ar__2._0_8_ & 0xffffffff00000000;
    sVar4 = EC_KEY_priv2oct((EC_KEY *)
                            key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl,buf,0x1f);
    gtest_ar_.success_ = SUB81(sVar4,0);
    gtest_ar_._1_7_ = SUB87(sVar4 >> 8,0);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)large_buf,"0u","EC_KEY_priv2oct(key.get(), buf, sizeof(buf) - 1)",
               (uint *)&gtest_ar__2,(unsigned_long *)&gtest_ar_);
    if (large_buf[0] == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      if (large_buf._8_8_ == 0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)large_buf._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0xdc,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
      if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(large_buf + 8));
    gtest_ar__10._0_4_ = 0x20;
    gtest_ar__2._0_8_ =
         EC_KEY_priv2oct((EC_KEY *)
                         key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl,large_buf,0x21);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&gtest_ar_,"32u",
               "EC_KEY_priv2oct(key.get(), large_buf, sizeof(large_buf))",(uint *)&gtest_ar__10,
               (unsigned_long *)&gtest_ar__2);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__2);
      if ((undefined8 *)
          CONCAT71(gtest_ar_.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._1_7_,
                   gtest_ar_.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._0_1_) == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)CONCAT71(gtest_ar_.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._1_7_,
                                    gtest_ar_.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._0_1_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__10,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0xe0,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__10,(Message *)&gtest_ar__2);
LAB_00295ae5:
      pAVar1 = &gtest_ar_;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__10);
      plVar6 = (long *)gtest_ar__2._0_8_;
      goto LAB_00295af9;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    gtest_ar__2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x20;
    gtest_ar__10._0_8_ = &(anonymous_namespace)::kECKeyWithZerosRawPrivate;
    gtest_ar__10.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x20;
    gtest_ar__2._0_8_ = buf;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)&gtest_ar_,"Bytes(buf)","Bytes(kECKeyWithZerosRawPrivate)",
               (Bytes *)&gtest_ar__2,(Bytes *)&gtest_ar__10);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__2);
      if ((undefined8 *)
          CONCAT71(gtest_ar_.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._1_7_,
                   gtest_ar_.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._0_1_) == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)CONCAT71(gtest_ar_.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._1_7_,
                                    gtest_ar_.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._0_1_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__10,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0xe1,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__10,(Message *)&gtest_ar__2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__10);
      if (gtest_ar__2._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    len = EC_KEY_priv2buf((EC_KEY *)
                          key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl,&buf_alloc);
    gtest_ar__2._0_8_ = gtest_ar__2._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
              ((internal *)&gtest_ar_,"len","0u",&len,(uint *)&gtest_ar__2);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__2);
      if ((undefined8 *)
          CONCAT71(gtest_ar_.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._1_7_,
                   gtest_ar_.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._0_1_) == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)CONCAT71(gtest_ar_.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._1_7_,
                                    gtest_ar_.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._0_1_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__10,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0xe6,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__10,(Message *)&gtest_ar__2);
      goto LAB_00295ae5;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    free_buf_alloc._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)buf_alloc;
    gtest_ar__2._0_8_ = buf_alloc;
    gtest_ar__2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )len;
    gtest_ar__10._0_8_ = &(anonymous_namespace)::kECKeyWithZerosRawPrivate;
    gtest_ar__10.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x20;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)&gtest_ar_,"Bytes(buf_alloc, len)","Bytes(kECKeyWithZerosRawPrivate)",
               (Bytes *)&gtest_ar__2,(Bytes *)&gtest_ar__10);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__2);
      if ((undefined8 *)
          CONCAT71(gtest_ar_.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._1_7_,
                   gtest_ar_.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._0_1_) == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)CONCAT71(gtest_ar_.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._1_7_,
                                    gtest_ar_.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._0_1_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__10,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0xe8,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__10,(Message *)&gtest_ar__2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__10);
      if (gtest_ar__2._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    DecodeECPrivateKey((anon_unknown_dwarf_4495f9 *)&gtest_ar_,
                       (anonymous_namespace)::kECKeyMissingZeros,0x5a);
    peVar5 = (pointer)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    std::__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter> *)&key,peVar5);
    std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_);
    gtest_ar__2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__2.success_ =
         (__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>)
         key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>)
        key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&gtest_ar__10);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&gtest_ar__2,(AssertionResult *)0x55f7b2,"false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0xec,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
      testing::internal::AssertHelper::operator=(&local_120,(Message *)&gtest_ar__10);
LAB_002962d6:
      this_00 = &gtest_ar__2.message_;
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      local_120.data_ = (AssertHelperData *)gtest_ar__10._0_8_;
LAB_002962ef:
      if (local_120.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_120.data_ + 8))();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__2.message_);
      bVar2 = EncodeECPrivateKey(&out,(EC_KEY *)
                                      key._M_t.
                                      super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t
                                      .super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
      gtest_ar__2.success_ = bVar2;
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (!bVar2) {
        testing::Message::Message((Message *)&gtest_ar__10);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
                   (AssertionResult *)"EncodeECPrivateKey(&out, key.get())","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_120,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0xed,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
        testing::internal::AssertHelper::operator=(&local_120,(Message *)&gtest_ar__10);
        testing::internal::AssertHelper::~AssertHelper(&local_120);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if (gtest_ar__10._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__10._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__2.message_);
      gtest_ar__2._0_8_ = &(anonymous_namespace)::kECKeyWithZeros;
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x79;
      gtest_ar__10.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )((long)out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
      gtest_ar__10._0_8_ =
           out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)&gtest_ar_,"Bytes(kECKeyWithZeros)","Bytes(out.data(), out.size())",
                 (Bytes *)&gtest_ar__2,(Bytes *)&gtest_ar__10);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__2);
        if ((undefined8 *)
            CONCAT71(gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._1_7_,
                     gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._0_1_) == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)CONCAT71(gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._1_7_,
                                      gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._0_1_);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__10,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0xee,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__10,(Message *)&gtest_ar__2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__10);
        if (gtest_ar__2._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      peVar5 = (pointer)EC_KEY_new_by_curve_name(0x19f);
      std::__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter> *)&key,peVar5);
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__2.success_ =
           (__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>)
           key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>)0x0;
      if ((__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>)
          key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>)0x0) {
        testing::Message::Message((Message *)&gtest_ar__10);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__2,(AssertionResult *)0x55f7b2,"false"
                   ,"true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_120,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0xf2,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
        testing::internal::AssertHelper::operator=(&local_120,(Message *)&gtest_ar__10);
        goto LAB_002962d6;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__2.message_);
      iVar3 = EC_KEY_oct2key((EC_KEY *)
                             key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t
                             .super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl,
                             (anonymous_namespace)::kECKeyWithZerosPublic,0x41,(BN_CTX *)0x0);
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__2.success_ = iVar3 != 0;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)&gtest_ar__10);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
                   (AssertionResult *)
                   "EC_KEY_oct2key(key.get(), kECKeyWithZerosPublic, sizeof(kECKeyWithZerosPublic), nullptr)"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_120,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0xf4,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
        testing::internal::AssertHelper::operator=(&local_120,(Message *)&gtest_ar__10);
        goto LAB_002962d6;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__2.message_);
      iVar3 = EC_KEY_oct2priv((EC_KEY *)
                              key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl,"",0x20);
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__2.success_ = iVar3 != 0;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)&gtest_ar__10);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
                   (AssertionResult *)
                   "EC_KEY_oct2priv(key.get(), kECKeyWithZerosRawPrivate, sizeof(kECKeyWithZerosRawPrivate))"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_120,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0xf6,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
        testing::internal::AssertHelper::operator=(&local_120,(Message *)&gtest_ar__10);
        goto LAB_002962d6;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__2.message_);
      bVar2 = EncodeECPrivateKey(&out,(EC_KEY *)
                                      key._M_t.
                                      super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t
                                      .super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
      gtest_ar__2.success_ = bVar2;
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (!bVar2) {
        testing::Message::Message((Message *)&gtest_ar__10);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
                   (AssertionResult *)"EncodeECPrivateKey(&out, key.get())","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_120,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0xf7,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
        testing::internal::AssertHelper::operator=(&local_120,(Message *)&gtest_ar__10);
        testing::internal::AssertHelper::~AssertHelper(&local_120);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if (gtest_ar__10._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__10._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__2.message_);
      gtest_ar__2._0_8_ = &(anonymous_namespace)::kECKeyWithZeros;
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x79;
      gtest_ar__10.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )((long)out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
      gtest_ar__10._0_8_ =
           out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)&gtest_ar_,"Bytes(kECKeyWithZeros)","Bytes(out.data(), out.size())",
                 (Bytes *)&gtest_ar__2,(Bytes *)&gtest_ar__10);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__2);
        if ((undefined8 *)
            CONCAT71(gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._1_7_,
                     gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._0_1_) == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)CONCAT71(gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._1_7_,
                                      gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._0_1_);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__10,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0xf8,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__10,(Message *)&gtest_ar__2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__10);
        if (gtest_ar__2._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      peVar5 = (pointer)EC_KEY_new_by_curve_name(0x19f);
      std::__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter> *)&key,peVar5);
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__2.success_ =
           (__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>)
           key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>)0x0;
      if ((__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>)
          key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>)0x0) {
        testing::Message::Message((Message *)&gtest_ar__10);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__2,(AssertionResult *)0x55f7b2,"false"
                   ,"true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_120,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0xfc,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
        testing::internal::AssertHelper::operator=(&local_120,(Message *)&gtest_ar__10);
        goto LAB_002962d6;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__2.message_);
      iVar3 = EC_KEY_oct2priv((EC_KEY *)
                              key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl,
                              (uint8_t *)
                              ((long)&(anonymous_namespace)::kECKeyWithZerosRawPrivate + 1),0x1f);
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__2.success_ = iVar3 == 0;
      if (iVar3 != 0) {
        testing::Message::Message((Message *)&gtest_ar__10);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
                   (AssertionResult *)
                   "EC_KEY_oct2priv(key.get(), kECKeyWithZerosRawPrivate + 1, sizeof(kECKeyWithZerosRawPrivate) - 1)"
                   ,"true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_120,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0xfe,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
        testing::internal::AssertHelper::operator=(&local_120,(Message *)&gtest_ar__10);
        testing::internal::AssertHelper::~AssertHelper(&local_120);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if (gtest_ar__10._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__10._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__2.message_);
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = 0;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._1_7_ = 0;
      iVar3 = EC_KEY_oct2priv((EC_KEY *)
                              key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl,
                              &gtest_ar_.success_,0x21);
      this_00 = &gtest_ar__10.message_;
      gtest_ar__10.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__10.success_ = iVar3 == 0;
      if (iVar3 != 0) {
        testing::Message::Message((Message *)&local_120);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__2,(internal *)&gtest_ar__10,
                   (AssertionResult *)"EC_KEY_oct2priv(key.get(), padded, sizeof(padded))","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x102,(char *)gtest_ar__2._0_8_);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_120);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        std::__cxx11::string::~string((string *)&gtest_ar__2);
        goto LAB_002962ef;
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&free_buf_alloc);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
LAB_00295b19:
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr(&key);
  return;
}

Assistant:

TEST(ECTest, ZeroPadding) {
  // Check that the correct encoding round-trips.
  bssl::UniquePtr<EC_KEY> key =
      DecodeECPrivateKey(kECKeyWithZeros, sizeof(kECKeyWithZeros));
  ASSERT_TRUE(key);
  std::vector<uint8_t> out;
  EXPECT_TRUE(EncodeECPrivateKey(&out, key.get()));
  EXPECT_EQ(Bytes(kECKeyWithZeros), Bytes(out.data(), out.size()));

  // Check the private key encodes correctly, including with the leading zeros.
  EXPECT_EQ(32u, EC_KEY_priv2oct(key.get(), nullptr, 0));
  uint8_t buf[32];
  ASSERT_EQ(32u, EC_KEY_priv2oct(key.get(), buf, sizeof(buf)));
  EXPECT_EQ(Bytes(buf), Bytes(kECKeyWithZerosRawPrivate));

  // Buffer too small.
  EXPECT_EQ(0u, EC_KEY_priv2oct(key.get(), buf, sizeof(buf) - 1));

  // Extra space in buffer.
  uint8_t large_buf[33];
  ASSERT_EQ(32u, EC_KEY_priv2oct(key.get(), large_buf, sizeof(large_buf)));
  EXPECT_EQ(Bytes(buf), Bytes(kECKeyWithZerosRawPrivate));

  // Allocating API.
  uint8_t *buf_alloc;
  size_t len = EC_KEY_priv2buf(key.get(), &buf_alloc);
  ASSERT_GT(len, 0u);
  bssl::UniquePtr<uint8_t> free_buf_alloc(buf_alloc);
  EXPECT_EQ(Bytes(buf_alloc, len), Bytes(kECKeyWithZerosRawPrivate));

  // Keys without leading zeros also parse, but they encode correctly.
  key = DecodeECPrivateKey(kECKeyMissingZeros, sizeof(kECKeyMissingZeros));
  ASSERT_TRUE(key);
  EXPECT_TRUE(EncodeECPrivateKey(&out, key.get()));
  EXPECT_EQ(Bytes(kECKeyWithZeros), Bytes(out.data(), out.size()));

  // Test the key can be constructed with |EC_KEY_oct2*|.
  key.reset(EC_KEY_new_by_curve_name(NID_X9_62_prime256v1));
  ASSERT_TRUE(key);
  ASSERT_TRUE(EC_KEY_oct2key(key.get(), kECKeyWithZerosPublic,
                             sizeof(kECKeyWithZerosPublic), nullptr));
  ASSERT_TRUE(EC_KEY_oct2priv(key.get(), kECKeyWithZerosRawPrivate,
                              sizeof(kECKeyWithZerosRawPrivate)));
  EXPECT_TRUE(EncodeECPrivateKey(&out, key.get()));
  EXPECT_EQ(Bytes(kECKeyWithZeros), Bytes(out.data(), out.size()));

  // |EC_KEY_oct2priv|'s format is fixed-width and must match the group order.
  key.reset(EC_KEY_new_by_curve_name(NID_X9_62_prime256v1));
  ASSERT_TRUE(key);
  EXPECT_FALSE(EC_KEY_oct2priv(key.get(), kECKeyWithZerosRawPrivate + 1,
                               sizeof(kECKeyWithZerosRawPrivate) - 1));
  uint8_t padded[sizeof(kECKeyWithZerosRawPrivate) + 1] = {0};
  memcpy(padded + 1, kECKeyWithZerosRawPrivate,
         sizeof(kECKeyWithZerosRawPrivate));
  EXPECT_FALSE(EC_KEY_oct2priv(key.get(), padded, sizeof(padded)));
}